

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O1

string * __thiscall
TUPU::base64_encode_abi_cxx11_
          (string *__return_storage_ptr__,TUPU *this,void *input,size_t input_len)

{
  size_t sVar1;
  size_t *psVar2;
  BIO_METHOD *pBVar3;
  BIO *pBVar4;
  BIO *append;
  long lVar5;
  void *__dest;
  BUF_MEM *bptr;
  size_t *local_30;
  
  local_30 = (size_t *)0x0;
  pBVar3 = BIO_f_base64();
  pBVar4 = BIO_new(pBVar3);
  pBVar3 = BIO_s_mem();
  append = BIO_new(pBVar3);
  pBVar4 = BIO_push(pBVar4,append);
  BIO_set_flags(pBVar4,0x100);
  BIO_write(pBVar4,this,(int)input);
  lVar5 = BIO_ctrl(pBVar4,0xb,0,(void *)0x0);
  if ((int)lVar5 == 1) {
    BIO_ctrl(pBVar4,0x73,0,&local_30);
    psVar2 = local_30;
    sVar1 = *local_30;
    __dest = malloc(sVar1 + 1);
    memcpy(__dest,(void *)psVar2[1],sVar1);
    *(undefined1 *)((long)__dest + *psVar2) = 0;
    sVar1 = *psVar2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__dest,(long)__dest + sVar1 + 1);
    free(__dest);
    BIO_free_all(pBVar4);
  }
  else {
    BIO_free_all(pBVar4);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

string TUPU::base64_encode(const void * input, size_t input_len)
{
    BIO *bmem, *b64;
    BUF_MEM * bptr = NULL;

    b64 = BIO_new(BIO_f_base64());
    bmem = BIO_new(BIO_s_mem());
    b64 = BIO_push(b64, bmem);

    //Ignore newlines - write everything in one line
    BIO_set_flags(b64, BIO_FLAGS_BASE64_NO_NL);

    BIO_write(b64, input, input_len);
    if (BIO_flush(b64) != 1) {
        BIO_free_all(b64);
        return "";
    }
    BIO_get_mem_ptr(b64, &bptr);

    char * buffer = (char *)malloc(bptr->length + 1);
    memcpy(buffer, bptr->data, bptr->length);
    buffer[bptr->length] = 0;
    string result(buffer, bptr->length + 1);
    free(buffer);

    //BIO_set_close(b64, BIO_NOCLOSE);
    BIO_free_all(b64);

    return result;
}